

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  int iVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int addr;
  int iDataCur;
  u8 exprAff;
  Vdbe *v;
  IndexedExpr *p;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int p3;
  int in_stack_ffffffffffffffcc;
  Parse *pParse_00;
  Parse *p_00;
  undefined8 uVar3;
  
  p_00 = *(Parse **)(in_RDI + 0x60);
  do {
    if (p_00 == (Parse *)0x0) {
      return -1;
    }
    in_stack_ffffffffffffffcc = CONCAT13(0xaa,(int3)in_stack_ffffffffffffffcc);
    p3 = *(int *)&p_00->zErrMsg;
    if (-1 < p3) {
      if (*(int *)(in_RDI + 0x44) != 0) {
        if (*(int *)&p_00->zErrMsg != *(int *)(in_RDI + 0x44) + -1) goto LAB_001cb5bb;
        p3 = -1;
      }
      iVar2 = sqlite3ExprCompare((Parse *)CONCAT44(in_stack_ffffffffffffffcc,p3),
                                 (Expr *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 (Expr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8),0);
      if (iVar2 == 0) {
        bVar1 = sqlite3ExprAffinity((Expr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                     in_stack_ffffffffffffffb8));
        in_stack_ffffffffffffffcc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
        if (((((0x41 < bVar1) || (*(char *)((long)&p_00->pVdbe + 5) == 'A')) &&
             ((bVar1 != 0x42 || (*(char *)((long)&p_00->pVdbe + 5) == 'B')))) &&
            ((bVar1 < 0x43 || (*(char *)((long)&p_00->pVdbe + 5) == 'C')))) &&
           (((*(uint *)(in_RSI + 4) & 0x80000000) == 0 ||
            (iVar2 = sqlite3ExprCanReturnSubtype
                               ((Parse *)CONCAT44(in_stack_ffffffffffffffcc,p3),
                                (Expr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                )), iVar2 == 0)))) {
          pParse_00 = *(Parse **)(in_RDI + 0x10);
          if (*(char *)((long)&((Vdbe *)p_00)->pVNext + 4) != '\0') {
            iVar2 = sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
            sqlite3VdbeAddOp3((Vdbe *)p_00,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                              in_stack_ffffffffffffffcc,p3);
            sqlite3VdbeAddOp3((Vdbe *)p_00,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                              in_stack_ffffffffffffffcc,p3);
            sqlite3VdbeGoto((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
            uVar3 = *(undefined8 *)(in_RDI + 0x60);
            *(undefined8 *)(in_RDI + 0x60) = 0;
            sqlite3ExprCode(pParse_00,(Expr *)CONCAT44(in_stack_ffffffffffffffcc,p3),iVar2);
            *(undefined8 *)(in_RDI + 0x60) = uVar3;
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffbc);
            return in_EDX;
          }
          sqlite3VdbeAddOp3((Vdbe *)p_00,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                            in_stack_ffffffffffffffcc,p3);
          return in_EDX;
        }
      }
    }
LAB_001cb5bb:
    p_00 = *(Parse **)&p_00->rc;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxEpr; p; p=p->pIENext){
    u8 exprAff;
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    assert( p->aff>=SQLITE_AFF_BLOB && p->aff<=SQLITE_AFF_NUMERIC );
    exprAff = sqlite3ExprAffinity(pExpr);
    if( (exprAff<=SQLITE_AFF_BLOB && p->aff!=SQLITE_AFF_BLOB)
     || (exprAff==SQLITE_AFF_TEXT && p->aff!=SQLITE_AFF_TEXT)
     || (exprAff>=SQLITE_AFF_NUMERIC && p->aff!=SQLITE_AFF_NUMERIC)
    ){
      /* Affinity mismatch on a generated column */
      continue;
    }


    /* Functions that might set a subtype should not be replaced by the
    ** value taken from an expression index if they are themselves an
    ** argument to another scalar function or aggregate.
    ** https://sqlite.org/forum/forumpost/68d284c86b082c3e */
    if( ExprHasProperty(pExpr, EP_SubtArg)
     && sqlite3ExprCanReturnSubtype(pParse, pExpr)
    ){
      continue;
    }

    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxEpr;
      pParse->pIdxEpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxEpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}